

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O2

char * __thiscall TCPConnection::GetStateString(TCPConnection *this)

{
  uint uVar1;
  
  uVar1 = this->State - LISTEN;
  if (uVar1 < 0xb) {
    return &DAT_0010ab48 + *(int *)(&DAT_0010ab48 + (ulong)uVar1 * 4);
  }
  return "CLOSED";
}

Assistant:

const char* TCPConnection::GetStateString() const
{
    const char* rc;
    switch (State)
    {
    case TCPConnection::CLOSED: rc = "CLOSED"; break;
    case TCPConnection::LISTEN: rc = "LISTEN"; break;
    case TCPConnection::SYN_SENT: rc = "SYN_SENT"; break;
    case TCPConnection::SYN_RECEIVED: rc = "SYN_RECEIVED"; break;
    case TCPConnection::ESTABLISHED: rc = "ESTABLISHED"; break;
    case TCPConnection::FIN_WAIT_1: rc = "FIN_WAIT_1"; break;
    case TCPConnection::FIN_WAIT_2: rc = "FIN_WAIT_2"; break;
    case TCPConnection::CLOSE_WAIT: rc = "CLOSE_WAIT"; break;
    case TCPConnection::CLOSING: rc = "CLOSING"; break;
    case TCPConnection::LAST_ACK: rc = "LAST_ACK"; break;
    case TCPConnection::TIMED_WAIT: rc = "TIMED_WAIT"; break;
    case TCPConnection::TTCP_PERSIST: rc = "TTCP_PERSIST"; break;
    }
    return rc;
}